

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O0

void dxil_spv::emit_buffer_synchronization_validation
               (Impl *impl,CallInst *instruction,BDAOperation bda_operation)

{
  Builder *this;
  CallInst *pCVar1;
  bool bVar2;
  RawWidth raw_width;
  uint uVar3;
  Id IVar4;
  Id type_id;
  Value *pVVar5;
  Type *pTVar6;
  Constant *this_00;
  APInt *this_01;
  uint64_t uVar7;
  Operation *pOVar8;
  Operation *pOVar9;
  Id local_12c;
  Operation *expect_true;
  Operation *in_bounds;
  Operation *load_invocation_id;
  Operation *call;
  Id call_id;
  Operation *add;
  Operation *mul;
  uint local_70;
  Id total_offset_id;
  uint elem_index;
  uint i;
  uint num_elems;
  uint width;
  mapped_type *local_58;
  mapped_type *access_meta;
  Type *pTStack_48;
  uint mask;
  Type *element_type;
  Id len_id;
  Id elem_id;
  Id offset_id;
  Id stride_id;
  Builder *builder;
  mapped_type *meta;
  Id image_id;
  BDAOperation bda_operation_local;
  CallInst *instruction_local;
  Impl *impl_local;
  
  if ((((impl->options).instruction_instrumentation.enabled & 1U) != 0) &&
     ((impl->options).instruction_instrumentation.type == BufferSynchronizationValidation)) {
    meta._4_4_ = bda_operation;
    _image_id = instruction;
    instruction_local = (CallInst *)impl;
    pVVar5 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
    meta._0_4_ = Converter::Impl::get_id_for_value(impl,pVVar5,0);
    builder = (Builder *)
              std::
              unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
              ::operator[]((unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
                            *)&instruction_local[0xf].super_Instruction.attachments._M_h.
                               _M_rehash_policy._M_next_resize,(key_type *)&meta);
    if ((*(int *)((long)&(builder->sourceText).field_2 + 4) == 0x14e5) ||
       (((ResourceMetaInstrumentation *)&(builder->extensions)._M_t._M_impl.field_0x4)->bda_id != 0)
       ) {
      _offset_id = Converter::Impl::builder((Impl *)instruction_local);
      elem_id = 0;
      len_id = 0;
      element_type._4_4_ = 0;
      element_type._0_4_ = _S_red;
      if ((meta._4_4_ == Store) || (meta._4_4_ == Load)) {
        if (meta._4_4_ == Store) {
          pVVar5 = LLVMBC::Instruction::getOperand(&_image_id->super_Instruction,4);
          pTStack_48 = LLVMBC::Value::getType(pVVar5);
        }
        else {
          pTVar6 = LLVMBC::Value::getType((Value *)_image_id);
          pTStack_48 = LLVMBC::Type::getStructElementType(pTVar6,0);
        }
        if ((*(char *)&builder->_vptr_Builder == '\v') || (*(char *)&builder->_vptr_Builder == '\f')
           ) {
          if (meta._4_4_ == Load) {
            _num_elems = _image_id;
            local_58 = std::
                       unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::CompositeMeta,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>_>
                       ::operator[]((unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::CompositeMeta,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>_>
                                     *)&instruction_local[10].super_Instruction.attachments._M_h.
                                        _M_before_begin,(key_type *)&num_elems);
            access_meta._4_4_ = local_58->access_mask & 0xf;
          }
          else {
            pVVar5 = LLVMBC::Instruction::getOperand(&_image_id->super_Instruction,8);
            this_00 = &LLVMBC::cast<LLVMBC::ConstantInt>(pVVar5)->super_Constant;
            this_01 = LLVMBC::Constant::getUniqueInteger(this_00);
            uVar7 = LLVMBC::APInt::getZExtValue(this_01);
            access_meta._4_4_ = (uint)uVar7;
          }
          raw_width = get_buffer_access_bits_per_component
                                ((Impl *)instruction_local,
                                 *(StorageClass *)((long)&(builder->sourceText).field_2 + 4),
                                 pTStack_48);
          uVar3 = raw_width_to_bits(raw_width);
          elem_index = 0;
          for (total_offset_id = 0; total_offset_id < 4; total_offset_id = total_offset_id + 1) {
            if ((access_meta._4_4_ & 1 << ((byte)total_offset_id & 0x1f)) != 0) {
              elem_index = total_offset_id + 1;
            }
          }
          element_type._0_4_ =
               spv::Builder::makeUintConstant(_offset_id,elem_index * uVar3 >> 3,false);
        }
        pCVar1 = instruction_local;
        if (*(char *)&builder->_vptr_Builder == '\v') {
          pVVar5 = LLVMBC::Instruction::getOperand(&_image_id->super_Instruction,2);
          len_id = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar5,0);
        }
        else if (*(char *)&builder->_vptr_Builder == '\f') {
          pVVar5 = LLVMBC::Instruction::getOperand(&_image_id->super_Instruction,2);
          element_type._4_4_ = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar5,0);
          pVVar5 = LLVMBC::Instruction::getOperand(&_image_id->super_Instruction,3);
          bVar2 = LLVMBC::isa<LLVMBC::UndefValue>(pVVar5);
          pCVar1 = instruction_local;
          if (!bVar2) {
            pVVar5 = LLVMBC::Instruction::getOperand(&_image_id->super_Instruction,3);
            len_id = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar5,0);
          }
          elem_id = spv::Builder::makeUintConstant(_offset_id,builder->source,false);
        }
        else if (*(char *)&builder->_vptr_Builder == '\n') {
          pVVar5 = LLVMBC::Instruction::getOperand(&_image_id->super_Instruction,2);
          element_type._4_4_ = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar5,0);
          elem_id = (builder->extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
          element_type._0_4_ =
               (builder->extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
        }
        else {
          pVVar5 = LLVMBC::Instruction::getOperand(&_image_id->super_Instruction,2);
          element_type._4_4_ = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar5,0);
          element_type._0_4_ = spv::Builder::makeUintConstant(_offset_id,0x10,false);
          elem_id = (_Rb_tree_color)element_type;
        }
      }
      else {
        bVar2 = value_is_dx_op_instrinsic((Value *)_image_id,AtomicCompareExchange);
        pCVar1 = instruction_local;
        if (bVar2) {
          local_70 = 2;
        }
        else {
          local_70 = 3;
        }
        if (*(char *)&builder->_vptr_Builder == '\v') {
          pVVar5 = LLVMBC::Instruction::getOperand(&_image_id->super_Instruction,local_70);
          len_id = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar5,0);
        }
        else if (*(char *)&builder->_vptr_Builder == '\f') {
          pVVar5 = LLVMBC::Instruction::getOperand(&_image_id->super_Instruction,local_70);
          element_type._4_4_ = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar5,0);
          pVVar5 = LLVMBC::Instruction::getOperand(&_image_id->super_Instruction,local_70 + 1);
          bVar2 = LLVMBC::isa<LLVMBC::UndefValue>(pVVar5);
          pCVar1 = instruction_local;
          if (!bVar2) {
            pVVar5 = LLVMBC::Instruction::getOperand(&_image_id->super_Instruction,local_70 + 1);
            len_id = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar5,0);
          }
          elem_id = spv::Builder::makeUintConstant(_offset_id,builder->source,false);
        }
        else if (*(char *)&builder->_vptr_Builder == '\n') {
          pVVar5 = LLVMBC::Instruction::getOperand(&_image_id->super_Instruction,local_70);
          element_type._4_4_ = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar5,0);
          elem_id = (builder->extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
        }
        this = _offset_id;
        pTVar6 = LLVMBC::Value::getType((Value *)_image_id);
        uVar3 = LLVMBC::Type::getIntegerBitWidth(pTVar6);
        element_type._0_4_ = spv::Builder::makeUintConstant(this,uVar3 >> 3,false);
      }
      pCVar1 = instruction_local;
      mul._4_4_ = 0;
      if (element_type._4_4_ != 0) {
        IVar4 = spv::Builder::makeUintType(_offset_id,0x20);
        pOVar8 = Converter::Impl::allocate((Impl *)pCVar1,OpIMul,IVar4);
        Operation::add_id(pOVar8,element_type._4_4_);
        Operation::add_id(pOVar8,elem_id);
        Converter::Impl::add((Impl *)instruction_local,pOVar8,false);
        mul._4_4_ = pOVar8->id;
      }
      pCVar1 = instruction_local;
      if (mul._4_4_ == 0) {
        mul._4_4_ = len_id;
      }
      else if (len_id != 0) {
        IVar4 = spv::Builder::makeUintType(_offset_id,0x20);
        pOVar8 = Converter::Impl::allocate((Impl *)pCVar1,OpIAdd,IVar4);
        Operation::add_id(pOVar8,mul._4_4_);
        Operation::add_id(pOVar8,len_id);
        Converter::Impl::add((Impl *)instruction_local,pOVar8,false);
        mul._4_4_ = pOVar8->id;
      }
      IVar4 = SPIRVModule::get_helper_call_id
                        ((SPIRVModule *)(instruction_local->super_Instruction).super_Value.tween_id,
                         ValidateBDALoadStore,0);
      pCVar1 = instruction_local;
      type_id = spv::Builder::makeBoolType(_offset_id);
      pOVar8 = Converter::Impl::allocate((Impl *)pCVar1,OpFunctionCall,type_id);
      Operation::add_id(pOVar8,IVar4);
      pCVar1 = instruction_local;
      if (*(int *)&(builder->extensions)._M_t._M_impl.field_0x4 == 0) {
        pVVar5 = LLVMBC::Instruction::getOperand(&_image_id->super_Instruction,1);
        local_12c = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar5,0);
      }
      else {
        local_12c = *(Id *)&(builder->extensions)._M_t._M_impl.field_0x4;
      }
      Operation::add_id(pOVar8,local_12c);
      Operation::add_id(pOVar8,mul._4_4_);
      Operation::add_id(pOVar8,(_Rb_tree_color)element_type);
      IVar4 = spv::Builder::makeUintConstant(_offset_id,meta._4_4_,false);
      Operation::add_id(pOVar8,IVar4);
      pCVar1 = instruction_local;
      IVar4 = spv::Builder::makeUintType(_offset_id,0x20);
      pOVar9 = Converter::Impl::allocate((Impl *)pCVar1,OpLoad,IVar4);
      Operation::add_id(pOVar9,*(Id *)&instruction_local[0xf].super_Instruction.attachments._M_h.
                                       _M_rehash_policy.field_0x4);
      Converter::Impl::add((Impl *)instruction_local,pOVar9,false);
      Operation::add_id(pOVar8,pOVar9->id);
      pCVar1 = instruction_local;
      if (*(int *)&(builder->extensions)._M_t._M_impl.super__Rb_tree_header._M_header.field_0x4 == 0
         ) {
        IVar4 = spv::Builder::makeBoolConstant(_offset_id,true,false);
        Operation::add_id(pOVar8,IVar4);
      }
      else {
        IVar4 = spv::Builder::makeBoolType(_offset_id);
        pOVar9 = Converter::Impl::allocate((Impl *)pCVar1,OpULessThan,IVar4);
        if (*(char *)&builder->_vptr_Builder == '\n') {
          Operation::add_id(pOVar9,element_type._4_4_);
        }
        else {
          Operation::add_id(pOVar9,mul._4_4_);
        }
        Operation::add_id(pOVar9,*(Id *)&(builder->extensions)._M_t._M_impl.super__Rb_tree_header.
                                         _M_header.field_0x4);
        Converter::Impl::add((Impl *)instruction_local,pOVar9,false);
        Operation::add_id(pOVar8,pOVar9->id);
      }
      Converter::Impl::add((Impl *)instruction_local,pOVar8,false);
      pOVar9 = Converter::Impl::allocate((Impl *)instruction_local,OpAssumeTrueKHR);
      Operation::add_id(pOVar9,pOVar8->id);
      Converter::Impl::add((Impl *)instruction_local,pOVar9,false);
    }
  }
  return;
}

Assistant:

void emit_buffer_synchronization_validation(Converter::Impl &impl,
                                            const llvm::CallInst *instruction,
                                            BDAOperation bda_operation)
{
	if (!impl.options.instruction_instrumentation.enabled ||
	    impl.options.instruction_instrumentation.type != InstructionInstrumentationType::BufferSynchronizationValidation)
	{
		return;
	}

	spv::Id image_id = impl.get_id_for_value(instruction->getOperand(1));
	const auto &meta = impl.handle_to_resource_meta[image_id];

	if (meta.storage != spv::StorageClassPhysicalStorageBuffer && meta.instrumentation.bda_id == 0)
		return;

	auto &builder = impl.builder();
	spv::Id stride_id = 0;
	spv::Id offset_id = 0;
	spv::Id elem_id = 0;
	spv::Id len_id = 0;

	if (bda_operation == BDAOperation::Store || bda_operation == BDAOperation::Load)
	{
		const llvm::Type *element_type;
		if (bda_operation == BDAOperation::Store)
			element_type = instruction->getOperand(4)->getType();
		else
			element_type = instruction->getType()->getStructElementType(0);

		if (meta.kind == DXIL::ResourceKind::RawBuffer || meta.kind == DXIL::ResourceKind::StructuredBuffer)
		{
			unsigned mask;

			if (bda_operation == BDAOperation::Load)
			{
				auto &access_meta = impl.llvm_composite_meta[instruction];
				mask = access_meta.access_mask & 0xf;
			}
			else
			{
				mask = llvm::cast<llvm::ConstantInt>(instruction->getOperand(8))->getUniqueInteger().getZExtValue();
			}

			unsigned width = raw_width_to_bits(get_buffer_access_bits_per_component(impl, meta.storage, element_type));

			unsigned num_elems = 0;
			for (unsigned i = 0; i < 4; i++)
				if ((mask & (1u << i)) != 0)
					num_elems = i + 1;

			len_id = builder.makeUintConstant(num_elems * width / 8);
		}

		if (meta.kind == DXIL::ResourceKind::RawBuffer)
		{
			offset_id = impl.get_id_for_value(instruction->getOperand(2));
		}
		else if (meta.kind == DXIL::ResourceKind::StructuredBuffer)
		{
			elem_id = impl.get_id_for_value(instruction->getOperand(2));
			if (!llvm::isa<llvm::UndefValue>(instruction->getOperand(3)))
				offset_id = impl.get_id_for_value(instruction->getOperand(3));
			stride_id = builder.makeUintConstant(meta.stride);
		}
		else if (meta.kind == DXIL::ResourceKind::TypedBuffer)
		{
			elem_id = impl.get_id_for_value(instruction->getOperand(2));
			stride_id = meta.instrumentation.elem_size_id;
			len_id = meta.instrumentation.elem_size_id;
		}
		else
		{
			elem_id = impl.get_id_for_value(instruction->getOperand(2));
			stride_id = builder.makeUintConstant(16);
			len_id = stride_id;
		}
	}
	else
	{
		unsigned elem_index;

		if (value_is_dx_op_instrinsic(instruction, DXIL::Op::AtomicCompareExchange))
			elem_index = 2;
		else
			elem_index = 3;

		if (meta.kind == DXIL::ResourceKind::RawBuffer)
		{
			offset_id = impl.get_id_for_value(instruction->getOperand(elem_index));
		}
		else if (meta.kind == DXIL::ResourceKind::StructuredBuffer)
		{
			elem_id = impl.get_id_for_value(instruction->getOperand(elem_index));
			if (!llvm::isa<llvm::UndefValue>(instruction->getOperand(elem_index + 1)))
				offset_id = impl.get_id_for_value(instruction->getOperand(elem_index + 1));
			stride_id = builder.makeUintConstant(meta.stride);
		}
		else if (meta.kind == DXIL::ResourceKind::TypedBuffer)
		{
			elem_id = impl.get_id_for_value(instruction->getOperand(elem_index));
			stride_id = meta.instrumentation.elem_size_id;
		}

		len_id = builder.makeUintConstant(instruction->getType()->getIntegerBitWidth() / 8);
	}

	spv::Id total_offset_id = 0;

	if (elem_id != 0)
	{
		auto *mul = impl.allocate(spv::OpIMul, builder.makeUintType(32));
		mul->add_id(elem_id);
		mul->add_id(stride_id);
		impl.add(mul);
		total_offset_id = mul->id;
	}

	if (!total_offset_id)
	{
		total_offset_id = offset_id;
	}
	else if (offset_id != 0)
	{
		auto *add = impl.allocate(spv::OpIAdd, builder.makeUintType(32));
		add->add_id(total_offset_id);
		add->add_id(offset_id);
		impl.add(add);
		total_offset_id = add->id;
	}

	spv::Id call_id = impl.spirv_module.get_helper_call_id(HelperCall::ValidateBDALoadStore);
	auto *call = impl.allocate(spv::OpFunctionCall, builder.makeBoolType());
	call->add_id(call_id);
	call->add_id(meta.instrumentation.bda_id ? meta.instrumentation.bda_id : impl.get_id_for_value(instruction->getOperand(1)));
	call->add_id(total_offset_id);
	call->add_id(len_id);
	call->add_id(builder.makeUintConstant(unsigned(bda_operation)));

	auto *load_invocation_id = impl.allocate(spv::OpLoad, builder.makeUintType(32));
	load_invocation_id->add_id(impl.instrumentation.invocation_id_var_id);
	impl.add(load_invocation_id);

	call->add_id(load_invocation_id->id);

	if (meta.instrumentation.resource_size_id)
	{
		auto *in_bounds = impl.allocate(spv::OpULessThan, builder.makeBoolType());

		if (meta.kind == DXIL::ResourceKind::TypedBuffer)
			in_bounds->add_id(elem_id);
		else
			in_bounds->add_id(total_offset_id);
		in_bounds->add_id(meta.instrumentation.resource_size_id);

		impl.add(in_bounds);
		call->add_id(in_bounds->id);
	}
	else
	{
		call->add_id(builder.makeBoolConstant(true));
	}

	impl.add(call);

	auto *expect_true = impl.allocate(spv::OpAssumeTrueKHR);
	expect_true->add_id(call->id);
	impl.add(expect_true);
}